

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

void pg::pm_stream(ostream *out,int *pm,int k)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  int local_20;
  int i;
  int k_local;
  int *pm_local;
  ostream *out_local;
  
  for (local_20 = 0; local_20 < k; local_20 = local_20 + 1) {
    if (pm[local_20] == -1) {
      std::operator<<(out," __");
    }
    else {
      if (local_20 == 0) {
        std::operator<<(out,"\x1b[33;1m");
      }
      poVar3 = std::operator<<(out," ");
      _Var1 = std::setfill<char>('0');
      poVar3 = std::operator<<(poVar3,_Var1._M_c);
      _Var2 = std::setw(2);
      poVar3 = std::operator<<(poVar3,_Var2);
      std::ostream::operator<<(poVar3,pm[local_20]);
      if (local_20 == 0) {
        std::operator<<(out,"\x1b[m");
      }
    }
  }
  return;
}

Assistant:

static void
pm_stream(std::ostream &out, int *pm, int k)
{
    for (int i=0; i<k; i++) {
        if (pm[i] != -1) {
            if (i == 0) out << "\033[33;1m";
            out << " " << std::setfill('0') << std::setw(2) << pm[i];
            if (i == 0) out << "\033[m";
        }
        else out << " __";
    }
}